

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_event_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload,uint32_t *rid)

{
  uint32_t rid_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MiniBusClient *this_00;
  string_view str;
  string_view str_00;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar1;
  MiniBusEncoder encoder;
  unique_lock<std::mutex> lock;
  MiniBusEncoder local_70;
  unique_lock<std::mutex> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this_00 = (MiniBusClient *)command._M_len;
  std::unique_lock<std::mutex>::unique_lock(&local_50,&this_00->mtx);
  rid_00 = select_rid(this_00);
  *(uint32_t *)encoder.buffer._M_dataplus._M_p = rid_00;
  local_70.buffer._M_dataplus._M_p = (pointer)&local_70.buffer.field_2;
  local_70.buffer._M_string_length = 0;
  local_70.buffer.field_2._M_local_buf[0] = '\0';
  MiniBusEncoder::insert_rid(&local_70,rid_00);
  str._M_str = (char *)payload._M_len;
  str._M_len = (size_t)command._M_str;
  MiniBusEncoder::insert_short_string(&local_70,str);
  str_00._M_str = (char *)rid;
  str_00._M_len = (size_t)payload._M_str;
  MiniBusEncoder::insert_long_string(&local_70,str_00);
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70.buffer._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.buffer._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_70.buffer._M_dataplus._M_p;
  }
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70.buffer._M_string_length;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_all_t>
            (&this_00->socket,&local_40,0);
  std::make_shared<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>();
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>&>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)&this_00->reqmap,(uint *)encoder.buffer._M_dataplus._M_p,
             (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  sVar1.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar1.
           super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<SyncNotifyToken<std::optional<std::string>>>
  send_event(std::string_view command, std::string_view payload, uint32_t &rid) {
    std::unique_lock lock{mtx};
    rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<SyncNotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }